

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockencodings.h
# Opt level: O2

void __thiscall
PartiallyDownloadedBlock::PartiallyDownloadedBlock
          (PartiallyDownloadedBlock *this,CTxMemPool *poolIn)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this->mempool_count = 0;
  this->extra_count = 0;
  (this->txn_available).
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->prefilled_count = 0;
  (this->txn_available).
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->txn_available).
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->pool = poolIn;
  CBlockHeader::CBlockHeader(&this->header);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    (this->m_check_block_mock).super__Function_base._M_manager = (_Manager_type)0x0;
    (this->m_check_block_mock)._M_invoker = (_Invoker_type)0x0;
    *(undefined8 *)&(this->m_check_block_mock).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(this->m_check_block_mock).super__Function_base._M_functor + 8) = 0;
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit PartiallyDownloadedBlock(CTxMemPool* poolIn) : pool(poolIn) {}